

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTryExpr(BinaryReaderIR *this,Type sig_type)

{
  bool bVar1;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_50;
  Enum local_44;
  Type local_40;
  ExprList *local_38;
  ExprList *expr_list;
  TryExpr *expr;
  __single_object expr_ptr;
  BinaryReaderIR *this_local;
  Type sig_type_local;
  
  expr_ptr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
  super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)
       (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)this;
  std::make_unique<wabt::TryExpr>();
  expr_list = (ExprList *)
              std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::get
                        ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)&expr);
  local_38 = &(((pointer)expr_list)->block).exprs;
  local_40 = sig_type;
  SetBlockDeclaration(this,&(((pointer)expr_list)->block).decl,sig_type);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::TryExpr,std::default_delete<wabt::TryExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_50,
             (unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)&expr);
  local_44 = (Enum)AppendExpr(this,&local_50);
  bVar1 = Failed((Result)local_44);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_50);
  if (bVar1) {
    Result::Result((Result *)&sig_type_local,Error);
  }
  else {
    (this->module_->features_used).exceptions = true;
    sig_type_local.enum_ = (Enum)PushLabel(this,Try,local_38,(Expr *)expr_list);
  }
  std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::~unique_ptr
            ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)&expr);
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderIR::OnTryExpr(Type sig_type) {
  auto expr_ptr = std::make_unique<TryExpr>();
  // Save expr so it can be used below, after expr_ptr has been moved.
  TryExpr* expr = expr_ptr.get();
  ExprList* expr_list = &expr->block.exprs;
  SetBlockDeclaration(&expr->block.decl, sig_type);
  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  module_->features_used.exceptions = true;
  return PushLabel(LabelType::Try, expr_list, expr);
}